

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::getAttributeData
          (LineRenderCase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *data)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  pointer pVVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  vector<int,_std::allocator<int>_> cellOrder;
  Random rnd;
  vector<int,_std::allocator<int>_> local_38;
  deRandom local_20;
  
  iVar4 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_38,(long)(iVar4 * iVar4 * 2),(allocator_type *)&local_20);
  deRandom_init(&local_20,0xde12345);
  auVar19 = _DAT_019ec5b0;
  uVar3 = (uint)((ulong)((long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  if (0 < (int)uVar3) {
    lVar5 = (ulong)(uVar3 & 0x7fffffff) - 1;
    auVar9._8_4_ = (int)lVar5;
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar9 = auVar9 ^ _DAT_019ec5b0;
    auVar10 = _DAT_019f34d0;
    do {
      bVar2 = auVar9._0_4_ < SUB164(auVar10 ^ auVar19,0);
      iVar4 = auVar9._4_4_;
      iVar20 = SUB164(auVar10 ^ auVar19,4);
      if ((bool)(~(iVar4 < iVar20 || iVar20 == iVar4 && bVar2) & 1)) {
        local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6] = (int)uVar6;
      }
      if (iVar4 >= iVar20 && (iVar20 != iVar4 || !bVar2)) {
        local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar6 + 1] = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar5 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar5 + 2;
    } while ((uVar3 + 1 & 0xfffffffe) != uVar6);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&local_20,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (data,(long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
  if (0 < (int)((ulong)((long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
    iVar4 = 0;
    lVar5 = 0;
    do {
      uVar3 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar5];
      iVar20 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
      lVar1 = CONCAT44((int)uVar3 >> 0x1f,(int)uVar3 >> 1);
      pVVar8 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + iVar4;
      auVar19._0_4_ = (float)iVar20;
      iVar7 = (int)(lVar1 % (long)iVar20);
      iVar20 = (int)(lVar1 / (long)iVar20);
      if ((uVar3 & 1) == 0) {
        auVar12._0_4_ = (float)(iVar20 + 1);
        auVar12._4_4_ = (float)iVar7;
        auVar12._8_8_ = 0;
        auVar18._0_4_ = (float)iVar20;
        auVar18._4_4_ = auVar12._4_4_;
        auVar18._8_8_ = 0;
        auVar19._4_4_ = auVar19._0_4_;
        auVar19._8_8_ = 0;
        auVar19 = divps(auVar18,auVar19);
        *(long *)pVVar8->m_data = auVar19._0_8_;
        pVVar8->m_data[2] = 0.0;
        pVVar8->m_data[3] = 1.0;
        pVVar8 = (data->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start + (iVar4 + 1);
        pVVar8->m_data[0] = 0.0;
        pVVar8->m_data[1] = 0.0;
        pVVar8->m_data[2] = 1.0;
        pVVar8->m_data[3] = 1.0;
        auVar15._0_4_ = (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4;
        auVar15._4_4_ = auVar15._0_4_;
        auVar15._8_4_ = auVar15._0_4_;
        auVar15._12_4_ = auVar15._0_4_;
        auVar19 = divps(auVar12,auVar15);
        uVar11 = auVar19._0_8_;
        uVar14 = 0x3f80000000000000;
      }
      else {
        auVar13._0_4_ = (float)iVar7;
        auVar13._4_4_ = (float)(iVar20 + 1);
        auVar13._8_8_ = 0;
        auVar21._4_4_ = (float)iVar20;
        auVar21._0_4_ = auVar13._0_4_;
        auVar21._8_4_ = auVar13._4_4_;
        auVar21._12_4_ = 0;
        auVar16._4_4_ = auVar19._0_4_;
        auVar16._0_4_ = auVar19._0_4_;
        auVar16._8_8_ = 0;
        auVar19 = divps(auVar21,auVar16);
        *(long *)pVVar8->m_data = auVar19._0_8_;
        pVVar8->m_data[2] = 0.0;
        pVVar8->m_data[3] = 1.0;
        pVVar8 = (data->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start + (iVar4 + 1);
        pVVar8->m_data[0] = 0.0;
        pVVar8->m_data[1] = 1.0;
        pVVar8->m_data[2] = 0.0;
        pVVar8->m_data[3] = 1.0;
        auVar17._0_4_ = (float)*(int *)&(this->super_BBoxRenderCase).field_0xd4;
        auVar17._4_4_ = auVar17._0_4_;
        auVar17._8_4_ = auVar17._0_4_;
        auVar17._12_4_ = auVar17._0_4_;
        auVar19 = divps(auVar13,auVar17);
        uVar11 = auVar19._0_8_;
        uVar14 = 0x3f800000;
      }
      pVVar8 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + (iVar4 + 2);
      *(undefined8 *)pVVar8->m_data = uVar11;
      pVVar8->m_data[2] = 0.0;
      pVVar8->m_data[3] = 1.0;
      iVar20 = iVar4 + 3;
      pVVar8 = (data->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar8[iVar20].m_data[0] = 0.0;
      *(undefined8 *)(pVVar8[iVar20].m_data + 1) = uVar14;
      pVVar8[iVar20].m_data[3] = 1.0;
      lVar5 = lVar5 + 1;
      iVar4 = iVar4 + 4;
    } while (lVar5 < (int)((ulong)((long)local_38.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_38.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void LineRenderCase::getAttributeData (std::vector<tcu::Vec4>& data) const
{
	const tcu::Vec4		green		(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4		blue		(0.0f, 0.0f, 1.0f, 1.0f);
	std::vector<int>	cellOrder	(m_patternSide * m_patternSide * 2);
	de::Random			rnd			(0xDE12345);

	// generate crosshatch pattern with segments in random order
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
		cellOrder[ndx] = ndx;
	rnd.shuffle(cellOrder.begin(), cellOrder.end());

	data.resize(cellOrder.size() * 4);
	for (int ndx = 0; ndx < (int)cellOrder.size(); ++ndx)
	{
		const int segmentID		= cellOrder[ndx];
		const int direction		= segmentID & 0x01;
		const int majorCoord	= (segmentID >> 1) / m_patternSide;
		const int minorCoord	= (segmentID >> 1) % m_patternSide;

		if (direction)
		{
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(minorCoord) / float(m_patternSide), float(majorCoord) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = green;
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(minorCoord) / float(m_patternSide), float(majorCoord + 1) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = green;
		}
		else
		{
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(majorCoord) / float(m_patternSide), float(minorCoord) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 0) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = blue;
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_POS_VEC_NDX] = tcu::Vec4(float(majorCoord + 1) / float(m_patternSide), float(minorCoord) / float(m_patternSide), 0.0f, 1.0f);
			data[(ndx * 2 + 1) * VA_NUM_ATTRIB_VECS + VA_COL_VEC_NDX] = blue;
		}
	}
}